

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::(anonymous_namespace)::ToCamelCase_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view input,
          bool lower_first)

{
  byte *pbVar1;
  string_view input_00;
  Nullable<const_char_*> failure_msg;
  undefined4 uVar2;
  _anonymous_namespace_ *p_Var3;
  undefined4 in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  size_type local_38;
  
  uVar2 = input._M_str._0_4_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (p_Var3 = (_anonymous_namespace_ *)0x0; this != p_Var3; p_Var3 = p_Var3 + 1) {
    if (p_Var3[input._M_len] != (_anonymous_namespace_)0x5f) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  if (((char)uVar2 != '\0') && (__return_storage_ptr__->_M_string_length != 0)) {
    pbVar1 = (byte *)(__return_storage_ptr__->_M_dataplus)._M_p;
    *pbVar1 = absl::lts_20250127::ascii_internal::kToLower[*pbVar1];
  }
  input_00._M_len._4_4_ = uVar2;
  input_00._M_len._0_4_ = in_stack_ffffffffffffffb0;
  input_00._M_str = in_stack_ffffffffffffffb8;
  anon_unknown_24::CamelCaseSize(input_00);
  local_38 = __return_storage_ptr__->_M_string_length;
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                          ((unsigned_long *)&stack0xffffffffffffffb8,&local_38,
                           "CamelCaseSize(input) == result.size()");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    return __return_storage_ptr__;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&stack0xffffffffffffffb8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,0x7f,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
            ((LogMessageFatal *)&stack0xffffffffffffffb8);
}

Assistant:

std::string ToCamelCase(const absl::string_view input, bool lower_first) {
  bool capitalize_next = !lower_first;
  std::string result;
  result.reserve(input.size());

  for (char character : input) {
    if (character == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(absl::ascii_toupper(character));
      capitalize_next = false;
    } else {
      result.push_back(character);
    }
  }

  // Lower-case the first letter.
  if (lower_first && !result.empty()) {
    result[0] = absl::ascii_tolower(result[0]);
  }

  ABSL_DCHECK_EQ(CamelCaseSize(input), result.size());

  return result;
}